

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O1

bool __thiscall TGAImage::read_tga_file(TGAImage *this,string *filename)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  ostream *poVar6;
  ifstream in;
  allocator_type local_25a;
  value_type_conflict local_259;
  undefined8 local_258;
  undefined8 uStack_250;
  ushort local_248;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  long local_220 [4];
  int aiStack_200 [122];
  
  std::ifstream::ifstream((string *)local_220);
  std::ifstream::open((string *)local_220,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"can\'t open file ",0x10);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::ifstream::close();
  }
  else {
    local_258 = 0;
    uStack_250 = 0;
    local_248 = 0;
    std::istream::read((char *)local_220,(long)&local_258);
    if (*(int *)((long)aiStack_200 + *(long *)(local_220[0] + -0x18)) == 0) {
      this->width = (uint)uStack_250._4_2_;
      this->height = (uint)uStack_250._6_2_;
      uVar3 = (uint)((byte)local_248 >> 3);
      this->bytespp = uVar3;
      if (((uStack_250._6_2_ != 0 && uStack_250._4_2_ != 0) && ((byte)local_248 >> 3 < 5)) &&
         ((0x1aU >> uVar3 & 1) != 0)) {
        local_259 = '\0';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_238,(ulong)((uint)uStack_250._6_2_ * (uint)uStack_250._4_2_ * uVar3),
                   &local_259,&local_25a);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  (&this->data,&local_238);
        if (local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_238.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_238.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_238.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((local_258._2_1_ & 0xfe) == 10) {
          bVar2 = load_rle_data(this,(ifstream *)local_220);
          if (bVar2) {
LAB_00102715:
            if ((local_248 & 0x2000) == 0) {
              flip_vertically(this);
            }
            if ((local_248 & 0x1000) != 0) {
              flip_horizontally(this);
            }
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/",1);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            bVar2 = true;
            std::ifstream::close();
            goto LAB_0010263a;
          }
LAB_001026e2:
          std::ifstream::close();
          lVar4 = 0x29;
          pcVar5 = "an error occurred while reading the data\n";
          poVar6 = (ostream *)&std::cerr;
        }
        else {
          if ((local_258._2_1_ & 0xfe) == 2) {
            std::istream::read((char *)local_220,
                               (long)(this->data).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
            if (*(int *)((long)aiStack_200 + *(long *)(local_220[0] + -0x18)) == 0)
            goto LAB_00102715;
            goto LAB_001026e2;
          }
          std::ifstream::close();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"unknown file format ",0x14);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          lVar4 = 1;
          pcVar5 = "\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar5,lVar4);
        goto LAB_00102638;
      }
      std::ifstream::close();
      lVar4 = 0x20;
      pcVar5 = "bad bpp (or width/height) value\n";
    }
    else {
      std::ifstream::close();
      lVar4 = 0x2b;
      pcVar5 = "an error occurred while reading the header\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
  }
LAB_00102638:
  bVar2 = false;
LAB_0010263a:
  std::ifstream::~ifstream(local_220);
  return bVar2;
}

Assistant:

bool TGAImage::read_tga_file(const std::string filename)
{
    std::ifstream in;
    in.open(filename, std::ios::binary);
    if (!in.is_open()) {
        std::cerr << "can't open file " << filename << "\n";
        in.close();
        return false;
    }
    TGA_Header header{};
    in.read(reinterpret_cast<char *>(&header), sizeof(header));
    if (!in.good()) {
        in.close();
        std::cerr << "an error occurred while reading the header\n";
        return false;
    }
    width = header.width;
    height = header.height;
    bytespp = header.bitsperpixel >> 3;
    if (width <= 0 || height <= 0 || (bytespp != GRAYSCALE && bytespp != RGB && bytespp != RGBA)) {
        in.close();
        std::cerr << "bad bpp (or width/height) value\n";
        return false;
    }
    size_t nbytes = bytespp * width * height;
    data = std::vector<std::uint8_t>(nbytes, 0);
    if (3 == header.datatypecode || 2 == header.datatypecode) {
        in.read(reinterpret_cast<char *>(data.data()), nbytes);
        if (!in.good()) {
            in.close();
            std::cerr << "an error occurred while reading the data\n";
            return false;
        }
    } else if (10 == header.datatypecode || 11 == header.datatypecode) {
        if (!load_rle_data(in)) {
            in.close();
            std::cerr << "an error occurred while reading the data\n";
            return false;
        }
    } else {
        in.close();
        std::cerr << "unknown file format " << (size_t)header.datatypecode << "\n";
        return false;
    }
    if (!(header.imagedescriptor & 0x20)) flip_vertically();
    if (header.imagedescriptor & 0x10) flip_horizontally();
    std::cerr << width << "x" << height << "/" << bytespp * 8 << "\n";
    in.close();
    return true;
}